

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_pminub_mips(uint64_t fs,uint64_t ft)

{
  uint8_t uVar1;
  uint local_2c;
  uint64_t uStack_28;
  uint i;
  LMIValue vt;
  LMIValue vs;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.d = fs;
  uStack_28 = ft;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    if (*(byte *)((long)&stack0xffffffffffffffd8 + (ulong)local_2c) < vt.ub[local_2c]) {
      uVar1 = *(uint8_t *)((long)&stack0xffffffffffffffd8 + (ulong)local_2c);
    }
    else {
      uVar1 = vt.ub[local_2c];
    }
    vt.ub[local_2c] = uVar1;
  }
  return vt.d;
}

Assistant:

uint64_t helper_pminub(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; i++) {
        vs.ub[i] = (vs.ub[i] <= vt.ub[i] ? vs.ub[i] : vt.ub[i]);
    }
    return vs.d;
}